

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::ChangeRPath
               (string *file,string *oldRPath,string *newRPath,string *emsg,bool *changed)

{
  string *this;
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  StringEntry *pSVar6;
  StringEntry *pSVar7;
  size_type sVar8;
  ostream *poVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  ulong local_350;
  char *se_name [2];
  StringEntry *se [2];
  cmELF elf;
  string local_2f8 [32];
  cmSystemToolsRPathInfo rp [2];
  ostringstream e;
  byte abStack_210 [480];
  
  if (changed != (bool *)0x0) {
    *changed = false;
  }
  lVar5 = 0xa0;
  paVar11 = &rp[0].Name.field_2;
  do {
    (((string *)(paVar11 + -1))->_M_dataplus)._M_p = (pointer)paVar11;
    *(size_type *)((long)paVar11 + -8) = 0;
    paVar11->_M_local_buf[0] = '\0';
    paVar11[1]._M_allocated_capacity = (size_type)(paVar11 + 2);
    *(undefined8 *)((long)paVar11 + 0x18) = 0;
    paVar11[2]._M_local_buf[0] = 0;
    paVar11 = paVar11 + 5;
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != 0);
  cmELF::cmELF(&elf,(file->_M_dataplus)._M_p);
  se[0] = (StringEntry *)0x0;
  se[1] = (StringEntry *)0x0;
  se_name[0] = (char *)0x0;
  se_name[1] = (char *)0x0;
  pSVar6 = cmELF::GetRPath(&elf);
  if (pSVar6 != (StringEntry *)0x0) {
    se_name[0] = "RPATH";
    se[0] = pSVar6;
  }
  pSVar7 = cmELF::GetRunPath(&elf);
  if (pSVar7 == (StringEntry *)0x0) {
    if (pSVar6 == (StringEntry *)0x0) {
      bVar3 = true;
      if (newRPath->_M_string_length == 0) {
        uVar14 = 0;
        bVar2 = false;
        bVar16 = true;
      }
      else if (emsg == (string *)0x0) {
        uVar14 = 0;
LAB_00138bd9:
        bVar2 = false;
        bVar16 = false;
      }
      else {
        std::__cxx11::string::assign((char *)emsg);
        uVar14 = 0;
        std::__cxx11::string::append((string *)emsg);
        bVar2 = false;
        bVar16 = false;
      }
      goto LAB_00138bdc;
    }
    local_350 = 1;
  }
  else {
    uVar14 = (uint)(pSVar6 != (StringEntry *)0x0);
    uVar12 = (ulong)(uVar14 * 8);
    *(StringEntry **)((long)se + uVar12) = pSVar7;
    *(char **)((long)se_name + uVar12) = "RUNPATH";
    local_350 = (ulong)(uVar14 + 1);
  }
  bVar3 = true;
  uVar14 = 0;
  for (uVar12 = 0; local_350 != uVar12; uVar12 = uVar12 + 1) {
    if (uVar14 == 0) {
      pSVar6 = se[uVar12];
LAB_001388f6:
      sVar8 = cmSystemToolsFindRPath(&pSVar6->Value,oldRPath);
      if (sVar8 == 0xffffffffffffffff) {
        sVar8 = cmSystemToolsFindRPath(&pSVar6->Value,newRPath);
        if (sVar8 == 0xffffffffffffffff) {
          if (emsg != (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar9 = std::operator<<((ostream *)&e,"The current ");
            poVar9 = std::operator<<(poVar9,se_name[uVar12]);
            poVar9 = std::operator<<(poVar9," is:\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)pSVar6);
            poVar9 = std::operator<<(poVar9,"\n");
            poVar9 = std::operator<<(poVar9,"which does not contain:\n");
            poVar9 = std::operator<<(poVar9,"  ");
            poVar9 = std::operator<<(poVar9,(string *)oldRPath);
            poVar9 = std::operator<<(poVar9,"\n");
            std::operator<<(poVar9,"as was expected.");
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)emsg,local_2f8);
            std::__cxx11::string::~string(local_2f8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          goto LAB_00138bd9;
        }
        bVar3 = false;
      }
      else {
        uVar1 = pSVar6->Size;
        rp[(int)uVar14].Position = pSVar6->Position;
        rp[(int)uVar14].Size = uVar1;
        std::__cxx11::string::assign((char *)&rp[(int)uVar14].Name);
        std::__cxx11::string::substr((ulong)&e,(ulong)pSVar6);
        this = &rp[(int)uVar14].Value;
        std::__cxx11::string::operator=((string *)this,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::substr((ulong)&e,(ulong)pSVar6);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)&e);
        sVar8 = rp[(int)uVar14].Value._M_string_length;
        bVar3 = (bool)(sVar8 == 0 & bVar3);
        if (rp[(int)uVar14].Size < sVar8 + 1) {
          if (emsg != (string *)0x0) {
            std::__cxx11::string::assign((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
            std::__cxx11::string::append((char *)emsg);
          }
          goto LAB_00138bd9;
        }
        uVar14 = uVar14 + 1;
      }
    }
    else {
      pSVar6 = se[uVar12];
      if (rp[0].Position != pSVar6->Position) goto LAB_001388f6;
    }
  }
  bVar16 = false;
  bVar2 = true;
LAB_00138bdc:
  cmELF::~cmELF(&elf);
  bVar4 = bVar16;
  if ((bVar2) && (bVar4 = true, uVar14 != 0)) {
    if (bVar3) {
      bVar4 = RemoveRPath(file,emsg,changed);
    }
    else {
      std::ofstream::ofstream(&e,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
      if ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0) {
        uVar15 = 0;
        uVar12 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar12 = uVar15;
        }
        do {
          if (uVar15 == uVar12) {
            bVar13 = 0;
            goto LAB_00138d71;
          }
          plVar10 = (long *)std::ostream::seekp(&e,rp[uVar15].Position,0);
          if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
            if (emsg == (string *)0x0) goto LAB_00138d6e;
            std::__cxx11::string::assign((char *)emsg);
            std::__cxx11::string::append((string *)emsg);
            goto LAB_00138d62;
          }
          std::operator<<((ostream *)&e,(string *)&rp[uVar15].Value);
          for (sVar8 = rp[uVar15].Value._M_string_length; sVar8 < rp[uVar15].Size; sVar8 = sVar8 + 1
              ) {
            std::operator<<((ostream *)&e,'\0');
          }
          uVar15 = uVar15 + 1;
        } while ((abStack_210[*(long *)(_e + -0x18)] & 5) == 0);
        if (emsg != (string *)0x0) {
          std::__cxx11::string::assign((char *)emsg);
          std::__cxx11::string::append((string *)emsg);
LAB_00138d62:
          std::__cxx11::string::append((char *)emsg);
        }
      }
      else if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
LAB_00138d6e:
      bVar13 = 1;
      bVar16 = false;
LAB_00138d71:
      std::ofstream::~ofstream(&e);
      if (changed == (bool *)0x0 || bVar13 != 0) {
        bVar4 = (bool)(bVar16 | bVar13 ^ 1);
      }
      else {
        *changed = true;
      }
    }
  }
  lVar5 = 0x50;
  do {
    cmSystemToolsRPathInfo::~cmSystemToolsRPathInfo
              ((cmSystemToolsRPathInfo *)((long)&rp[0].Position + lVar5));
    lVar5 = lVar5 + -0x50;
  } while (lVar5 != -0x50);
  return bVar4;
}

Assistant:

bool cmSystemTools::ChangeRPath(std::string const& file,
                                std::string const& oldRPath,
                                std::string const& newRPath,
                                std::string* emsg,
                                bool* changed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if(changed)
    {
    *changed = false;
    }
  int rp_count = 0;
  bool remove_rpath = true;
  cmSystemToolsRPathInfo rp[2];
  {
  // Parse the ELF binary.
  cmELF elf(file.c_str());

  // Get the RPATH and RUNPATH entries from it.
  int se_count = 0;
  cmELF::StringEntry const* se[2] = {0, 0};
  const char* se_name[2] = {0, 0};
  if(cmELF::StringEntry const* se_rpath = elf.GetRPath())
    {
    se[se_count] = se_rpath;
    se_name[se_count] = "RPATH";
    ++se_count;
    }
  if(cmELF::StringEntry const* se_runpath = elf.GetRunPath())
    {
    se[se_count] = se_runpath;
    se_name[se_count] = "RUNPATH";
    ++se_count;
    }
  if(se_count == 0)
    {
    if(newRPath.empty())
      {
      // The new rpath is empty and there is no rpath anyway so it is
      // okay.
      return true;
      }
    else
      {
      if(emsg)
        {
        *emsg = "No valid ELF RPATH or RUNPATH entry exists in the file; ";
        *emsg += elf.GetErrorMessage();
        }
      return false;
      }
    }

  for(int i=0; i < se_count; ++i)
    {
    // If both RPATH and RUNPATH refer to the same string literal it
    // needs to be changed only once.
    if(rp_count && rp[0].Position == se[i]->Position)
      {
      continue;
      }

    // Make sure the current rpath contains the old rpath.
    std::string::size_type pos =
      cmSystemToolsFindRPath(se[i]->Value, oldRPath);
    if(pos == std::string::npos)
      {
      // If it contains the new rpath instead then it is okay.
      if(cmSystemToolsFindRPath(se[i]->Value, newRPath) != std::string::npos)
        {
        remove_rpath = false;
        continue;
        }
      if(emsg)
        {
        std::ostringstream e;
        e << "The current " << se_name[i] << " is:\n"
          << "  " << se[i]->Value << "\n"
          << "which does not contain:\n"
          << "  " << oldRPath << "\n"
          << "as was expected.";
        *emsg = e.str();
        }
      return false;
      }

    // Store information about the entry in the file.
    rp[rp_count].Position = se[i]->Position;
    rp[rp_count].Size = se[i]->Size;
    rp[rp_count].Name = se_name[i];

    std::string::size_type prefix_len = pos;

    // If oldRPath was at the end of the file's RPath, and newRPath is empty,
    // we should remove the unnecessary ':' at the end.
    if (newRPath.empty() &&
        pos > 0 &&
        se[i]->Value[pos - 1] == ':' &&
        pos + oldRPath.length() == se[i]->Value.length())
      {
      prefix_len--;
      }

    // Construct the new value which preserves the part of the path
    // not being changed.
    rp[rp_count].Value = se[i]->Value.substr(0, prefix_len);
    rp[rp_count].Value += newRPath;
    rp[rp_count].Value += se[i]->Value.substr(pos+oldRPath.length(),
                                              oldRPath.npos);

    if (!rp[rp_count].Value.empty())
      {
      remove_rpath = false;
      }

    // Make sure there is enough room to store the new rpath and at
    // least one null terminator.
    if(rp[rp_count].Size < rp[rp_count].Value.length()+1)
      {
      if(emsg)
        {
        *emsg = "The replacement path is too long for the ";
        *emsg += se_name[i];
        *emsg += " entry.";
        }
      return false;
      }

    // This entry is ready for update.
    ++rp_count;
    }
  }

  // If no runtime path needs to be changed, we are done.
  if(rp_count == 0)
    {
    return true;
    }

  // If the resulting rpath is empty, just remove the entire entry instead.
  if (remove_rpath)
    {
    return cmSystemTools::RemoveRPath(file, emsg, changed);
    }

  {
  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                  std::ios::in | std::ios::out | std::ios::binary);
  if(!f)
    {
    if(emsg)
      {
      *emsg = "Error opening file for update.";
      }
    return false;
    }

  // Store the new RPATH and RUNPATH strings.
  for(int i=0; i < rp_count; ++i)
    {
    // Seek to the RPATH position.
    if(!f.seekp(rp[i].Position))
      {
      if(emsg)
        {
        *emsg = "Error seeking to ";
        *emsg += rp[i].Name;
        *emsg += " position.";
        }
      return false;
      }

    // Write the new rpath.  Follow it with enough null terminators to
    // fill the string table entry.
    f << rp[i].Value;
    for(unsigned long j=rp[i].Value.length(); j < rp[i].Size; ++j)
      {
      f << '\0';
      }

    // Make sure it wrote correctly.
    if(!f)
      {
      if(emsg)
        {
        *emsg = "Error writing the new ";
        *emsg += rp[i].Name;
        *emsg += " string to the file.";
        }
      return false;
      }
    }
  }

  // Everything was updated successfully.
  if(changed)
    {
    *changed = true;
    }
  return true;
#else
  (void)file;
  (void)oldRPath;
  (void)newRPath;
  (void)emsg;
  (void)changed;
  return false;
#endif
}